

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.h
# Opt level: O0

void __thiscall
r_exec::HLPController::_store_evidence<r_exec::HLPController::PEEntry>
          (HLPController *this,Cache<r_exec::HLPController::PEEntry> *cache,_Fact *evidence)

{
  bool bVar1;
  EEntry *this_00;
  iterator iVar2;
  const_iterator cVar3;
  const_iterator local_a0;
  iterator local_90;
  iterator local_80;
  undefined1 local_70 [8];
  const_iterator _e;
  uint64_t now;
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> guard;
  PEEntry e;
  _Fact *evidence_local;
  Cache<r_exec::HLPController::PEEntry> *cache_local;
  HLPController *this_local;
  
  PEEntry::PEEntry((PEEntry *)&guard,evidence);
  std::lock_guard<std::mutex>::lock_guard(&local_48,&cache->mutex);
  _e._list = (list<r_exec::HLPController::PEEntry> *)(*Now)();
  r_code::list<r_exec::HLPController::PEEntry>::const_iterator::const_iterator
            ((const_iterator *)local_70);
  local_80 = r_code::list<r_exec::HLPController::PEEntry>::begin(&cache->evidences);
  r_code::list<r_exec::HLPController::PEEntry>::const_iterator::operator=
            ((const_iterator *)local_70,&local_80);
  while( true ) {
    iVar2 = r_code::list<r_exec::HLPController::PEEntry>::end(&cache->evidences);
    local_90 = iVar2;
    bVar1 = r_code::list<r_exec::HLPController::PEEntry>::_iterator::operator!=
                      ((_iterator *)local_70,&local_90.super__iterator);
    if (!bVar1) break;
    this_00 = &r_code::list<r_exec::HLPController::PEEntry>::const_iterator::operator*
                         ((const_iterator *)local_70)->super_EEntry;
    bVar1 = EEntry::is_too_old(this_00,(uint64_t)_e._list);
    if (bVar1) {
      cVar3 = r_code::list<r_exec::HLPController::PEEntry>::erase
                        (&cache->evidences,(const_iterator *)local_70);
      local_a0 = cVar3;
      r_code::list<r_exec::HLPController::PEEntry>::const_iterator::operator=
                ((const_iterator *)local_70,&local_a0);
    }
    else {
      r_code::list<r_exec::HLPController::PEEntry>::const_iterator::operator++
                ((const_iterator *)local_70);
    }
  }
  r_code::list<r_exec::HLPController::PEEntry>::push_front(&cache->evidences,(PEEntry *)&guard);
  std::lock_guard<std::mutex>::~lock_guard(&local_48);
  PEEntry::~PEEntry((PEEntry *)&guard);
  return;
}

Assistant:

void _store_evidence(Cache<E> *cache, _Fact *evidence)
    {
        E e(evidence);
        std::lock_guard<std::mutex> guard(cache->mutex);
        uint64_t now = r_exec::Now();
        typename r_code::list<E>::const_iterator _e;

        for (_e = cache->evidences.begin(); _e != cache->evidences.end();) {
            if ((*_e).is_too_old(now)) { // garbage collection.
                _e = cache->evidences.erase(_e);
            } else {
                ++_e;
            }
        }

        cache->evidences.push_front(e);
    }